

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observers.cpp
# Opt level: O2

int main(void)

{
  bool *value;
  bool *value_00;
  int local_bc;
  ObserverB b;
  ObserverC c;
  ObserverA a;
  O o;
  
  obs::safe_list<Observer>::safe_list((safe_list<Observer> *)&o);
  b.super_Observer._vptr_Observer = (_func_int **)&PTR__Observer_00105d28;
  b.b = false;
  b.a_arg = -1;
  a.super_Observer._vptr_Observer = (_func_int **)&PTR__Observer_00105cc8;
  a.a = false;
  c.super_Observer._vptr_Observer = (_func_int **)&PTR__Observer_00105d78;
  c.c = false;
  c.a_arg = -1;
  c.b_arg = -1;
  obs::safe_list<Observer>::push_back((safe_list<Observer> *)&o,&a.super_Observer);
  obs::safe_list<Observer>::push_back((safe_list<Observer> *)&o,&b.super_Observer);
  obs::safe_list<Observer>::push_back((safe_list<Observer> *)&o,&c.super_Observer);
  obs::observers<Observer>::notify_observers<>((observers<Observer> *)&o,0x11);
  local_bc._0_1_ = true;
  expect_eq<bool,bool>
            ((bool *)&local_bc,&a.a,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x3f);
  value = &b.b;
  local_bc._0_1_ = false;
  expect_eq<bool,bool>
            ((bool *)&local_bc,value,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x40);
  value_00 = &c.c;
  local_bc._0_1_ = false;
  expect_eq<bool,bool>
            ((bool *)&local_bc,value_00,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x41);
  obs::observers<Observer>::notify_observers<int>((observers<Observer> *)&o,0x19,0);
  local_bc._0_1_ = true;
  expect_eq<bool,bool>
            ((bool *)&local_bc,value,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x44);
  local_bc = (uint)local_bc._1_3_ << 8;
  expect_eq<bool,bool>
            ((bool *)&local_bc,value_00,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x45);
  local_bc = 1;
  expect_eq<int,int>(&local_bc,&b.a_arg,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
                     ,0x46);
  obs::observers<Observer>::notify_observers<int,int>((observers<Observer> *)&o,0x21,0,1);
  local_bc._0_1_ = true;
  expect_eq<bool,bool>
            ((bool *)&local_bc,value,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x49);
  local_bc = CONCAT31(local_bc._1_3_,1);
  expect_eq<bool,bool>
            ((bool *)&local_bc,value_00,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x4a);
  local_bc = 1;
  expect_eq<int,int>(&local_bc,&c.a_arg,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
                     ,0x4b);
  local_bc = 2;
  expect_eq<int,int>(&local_bc,&c.b_arg,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
                     ,0x4c);
  obs::safe_list<Observer>::~safe_list((safe_list<Observer> *)&o);
  return 0;
}

Assistant:

int main() {
  O o;
  ObserverA a;
  ObserverB b;
  ObserverC c;
  o.add_observer(&a);
  o.add_observer(&b);
  o.add_observer(&c);

  o.notify_observers(&Observer::on_event_a);
  EXPECT_TRUE(a.a);
  EXPECT_FALSE(b.b);
  EXPECT_FALSE(c.c);

  o.notify_observers(&Observer::on_event_b, 1);
  EXPECT_TRUE(b.b);
  EXPECT_FALSE(c.c);
  EXPECT_EQ(1, b.a_arg);

  o.notify_observers(&Observer::on_event_c, 1, 2);
  EXPECT_TRUE(b.b);
  EXPECT_TRUE(c.c);
  EXPECT_EQ(1, c.a_arg);
  EXPECT_EQ(2, c.b_arg);
}